

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O3

string * __thiscall
GNB::predict_abi_cxx11_
          (string *__return_storage_ptr__,GNB *this,vector<double,_std::allocator<double>_> *sample)

{
  pointer pcVar1;
  double dVar2;
  pointer pbVar3;
  size_type *psVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [272];
  
  dVar12 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_left_s;
  local_128._0_8_ =
       exp((-dVar12 * dVar12) / (stddev_left_s * stddev_left_s + stddev_left_s * stddev_left_s));
  dVar12 = stddev_left_s * stddev_left_s * 6.283185307179586;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar13 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[1] - mean_left_d;
  local_128._8_8_ =
       exp((-dVar13 * dVar13) / (stddev_left_d * stddev_left_d + stddev_left_d * stddev_left_d));
  dVar13 = stddev_left_s * stddev_left_s * 6.283185307179586;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar14 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_left_s_dot;
  local_138._0_8_ =
       exp((-dVar14 * dVar14) /
           (stddev_left_s_dot * stddev_left_s_dot + stddev_left_s_dot * stddev_left_s_dot));
  dVar14 = stddev_left_s_dot * stddev_left_s_dot * 6.283185307179586;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  dVar15 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[3] - mean_left_d_dot;
  local_138._8_8_ =
       exp((-dVar15 * dVar15) /
           (stddev_left_d_dot * stddev_left_d_dot + stddev_left_d_dot * stddev_left_d_dot));
  dVar15 = stddev_left_d_dot * stddev_left_d_dot * 6.283185307179586;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  dVar26 = p_left;
  dVar16 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_keep_s;
  dVar16 = exp((-dVar16 * dVar16) / (stddev_keep_s * stddev_keep_s + stddev_keep_s * stddev_keep_s))
  ;
  dVar17 = stddev_keep_s * stddev_keep_s * 6.283185307179586;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  dVar18 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[1] - mean_keep_d;
  dVar18 = exp((-dVar18 * dVar18) / (stddev_keep_d * stddev_keep_d + stddev_keep_d * stddev_keep_d))
  ;
  dVar5 = stddev_keep_s * stddev_keep_s * 6.283185307179586;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar19 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_keep_s_dot;
  dVar19 = exp((-dVar19 * dVar19) /
               (stddev_keep_s_dot * stddev_keep_s_dot + stddev_keep_s_dot * stddev_keep_s_dot));
  dVar20 = stddev_keep_s_dot * stddev_keep_s_dot * 6.283185307179586;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  dVar21 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[3] - mean_keep_d_dot;
  dVar21 = exp((-dVar21 * dVar21) /
               (stddev_keep_d_dot * stddev_keep_d_dot + stddev_keep_d_dot * stddev_keep_d_dot));
  dVar6 = stddev_keep_d_dot * stddev_keep_d_dot * 6.283185307179586;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar2 = p_keep;
  dVar22 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_right_s;
  local_148._0_8_ =
       exp((-dVar22 * dVar22) / (stddev_right_s * stddev_right_s + stddev_right_s * stddev_right_s))
  ;
  dVar22 = stddev_right_s * stddev_right_s * 6.283185307179586;
  if (dVar22 < 0.0) {
    dVar22 = sqrt(dVar22);
  }
  else {
    dVar22 = SQRT(dVar22);
  }
  dVar23 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[1] - mean_right_d;
  local_148._8_8_ =
       exp((-dVar23 * dVar23) / (stddev_right_d * stddev_right_d + stddev_right_d * stddev_right_d))
  ;
  dVar23 = stddev_right_s * stddev_right_s * 6.283185307179586;
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  dVar24 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_right_s_dot;
  dVar24 = exp((-dVar24 * dVar24) /
               (stddev_right_s_dot * stddev_right_s_dot + stddev_right_s_dot * stddev_right_s_dot));
  dVar25 = stddev_right_s_dot * stddev_right_s_dot * 6.283185307179586;
  if (dVar25 < 0.0) {
    dVar25 = sqrt(dVar25);
  }
  else {
    dVar25 = SQRT(dVar25);
  }
  auVar7._8_8_ = dVar13;
  auVar7._0_8_ = dVar12;
  auVar7 = divpd(local_128._0_16_,auVar7);
  auVar8._8_8_ = dVar15;
  auVar8._0_8_ = dVar14;
  auVar8 = divpd(local_138,auVar8);
  dVar12 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[3] - mean_right_d_dot;
  auVar9._8_8_ = dVar23;
  auVar9._0_8_ = dVar22;
  auVar9 = divpd(local_148,auVar9);
  dVar12 = exp((-dVar12 * dVar12) /
               (stddev_right_d_dot * stddev_right_d_dot + stddev_right_d_dot * stddev_right_d_dot));
  dVar13 = stddev_right_d_dot * stddev_right_d_dot * 6.283185307179586;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  auVar28._8_8_ = dVar12;
  auVar28._0_8_ = dVar24;
  auVar29._8_8_ = dVar13;
  auVar29._0_8_ = dVar25;
  auVar29 = divpd(auVar28,auVar29);
  local_128._0_8_ = auVar7._0_8_;
  local_128._8_8_ = auVar7._8_8_;
  local_148._0_8_ = auVar9._0_8_;
  local_148._8_8_ = auVar9._8_8_;
  local_138._0_8_ = auVar8._0_8_;
  local_138._8_8_ = auVar8._8_8_;
  dVar26 = dVar26 * (double)local_138._8_8_ *
                    (double)local_138._0_8_ * (double)local_128._8_8_ * (double)local_128._0_8_;
  if (p_right * auVar29._8_8_ * auVar29._0_8_ * (double)local_148._8_8_ * (double)local_148._0_8_ <=
      dVar26) {
    auVar27._8_8_ = dVar18;
    auVar27._0_8_ = dVar16;
    auVar10._8_8_ = dVar5;
    auVar10._0_8_ = dVar17;
    auVar7 = divpd(auVar27,auVar10);
    auVar30._8_8_ = dVar21;
    auVar30._0_8_ = dVar19;
    auVar11._8_8_ = dVar6;
    auVar11._0_8_ = dVar20;
    auVar9 = divpd(auVar30,auVar11);
    pbVar3 = (this->possible_labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (dVar2 * auVar9._8_8_ * auVar7._8_8_ * auVar7._0_8_ * auVar9._0_8_ <= dVar26) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = &pbVar3->_M_string_length;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = &pbVar3[1]._M_string_length;
      pbVar3 = pbVar3 + 1;
    }
  }
  else {
    pbVar3 = (this->possible_labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = &pbVar3[1]._M_string_length;
    pbVar3 = pbVar3 + 1;
  }
  pcVar1 = (pbVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + *psVar4);
  return __return_storage_ptr__;
}

Assistant:

string GNB::predict(const vector<double> &sample)
{
  /**
   * Once trained, this method is called and expected to return 
   *   a predicted behavior for the given observation.
   * @param observation - a 4 tuple with s, d, s_dot, d_dot.
   *   - Example: [3.5, 0.1, 8.5, -0.2]
   * @output A label representing the best guess of the classifier. Can
   *   be one of "left", "keep" or "right".
   *
   * TODO: Complete this function to return your classifier's prediction
   */
  double prob_s;
  double prob_left = 1;
  double prob_keep = 1;
  double prob_right = 1;

  // prob of s being left * prob of d being left * prob of sdot being left * prob of ddot being left
  // prob of s being keep * prob of d being keep * prob of sdot being keep * prob of ddot being keep
  // prob of s being right * prob of d being right * prob of sdot being right * prob of ddot being right
  // Once you have all these probs, find the max one out of them.

  // prob of being left
  prob_s = exp(-1 * pow(sample[0] - mean_left_s, 2) / (2 * pow(stddev_left_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_left_d, 2) / (2 * pow(stddev_left_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_left_s_dot, 2) / (2 * pow(stddev_left_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s_dot, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_left_d_dot, 2) / (2 * pow(stddev_left_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_d_dot, 2));
  prob_left *= prob_s;
  prob_left *= p_left;

  // prob of being keep
  prob_s = exp(-1 * pow(sample[0] - mean_keep_s, 2) / (2 * pow(stddev_keep_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_keep_d, 2) / (2 * pow(stddev_keep_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_keep_s_dot, 2) / (2 * pow(stddev_keep_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s_dot, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_keep_d_dot, 2) / (2 * pow(stddev_keep_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_d_dot, 2));
  prob_keep *= prob_s;
  prob_keep *= p_keep;

  // prob of being right
  prob_s = exp(-1 * pow(sample[0] - mean_right_s, 2) / (2 * pow(stddev_right_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_right_d, 2) / (2 * pow(stddev_right_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_right_s_dot, 2) / (2 * pow(stddev_right_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s_dot, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_right_d_dot, 2) / (2 * pow(stddev_right_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_d_dot, 2));
  prob_right *= prob_s;
  prob_right *= p_right;

  if (prob_left >= prob_right)
  {
    if (prob_left >= prob_keep)
    {
      return this->possible_labels[0];
    }
    else
    {
      return this->possible_labels[1];
    }
  }
  else
  {
    return this->possible_labels[1];
  }
}